

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O3

bool __thiscall SVGChart::PPlot::DrawGridYAxis(PPlot *this,PRect *inRect,Painter *inPainter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_XMM0_Da;
  bool theIsMajorTick;
  float theY;
  string theFormatString;
  char local_55;
  undefined4 local_54;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mStyle);
  (*inPainter->_vptr_Painter[0xc])(inPainter,&(this->mYAxisSetup).mTickInfo.mStyle);
  iVar1 = (*this->mYTickIterator->_vptr_TickIterator[2])();
  if ((char)iVar1 != '\0') {
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    (*inPainter->_vptr_Painter[7])(inPainter,200,200,200);
    (*inPainter->_vptr_Painter[6])(inPainter,200,200,200);
    if ((this->mYAxisSetup).mTickInfo.mTicksOn == true) {
      while (iVar2 = (*this->mYTickIterator->_vptr_TickIterator[3])
                               (this->mYTickIterator,&local_54,&local_55,&local_50),
            (char)iVar2 != '\0') {
        if ((local_55 == '\x01') && ((this->mGridInfo).mYGridOn == true)) {
          (*this->mYTrafo->_vptr_Trafo[2])(local_54);
          (**inPainter->_vptr_Painter)
                    ((float)inRect->mX,extraout_XMM0_Da,(float)(inRect->mX + inRect->mW),
                     extraout_XMM0_Da,inPainter);
        }
      }
    }
    (*inPainter->_vptr_Painter[7])(inPainter,0,0,0);
    (*inPainter->_vptr_Painter[6])(inPainter,0,0,0);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
  }
  return (bool)(char)iVar1;
}

Assistant:

bool PPlot::DrawGridYAxis (const PRect &inRect, Painter &inPainter) const {
        inPainter.SetStyle (mYAxisSetup.mStyle);
        
        // ticks
        inPainter.SetStyle (mYAxisSetup.mTickInfo.mStyle);
        if (!mYTickIterator->Init ()) {
            return false;
        }
        
        float theY;
        bool theIsMajorTick;
        string theFormatString;
        PRect theTickRect;

        inPainter.SetFillColor (200,200,200);
        inPainter.SetLineColor (200,200,200);
        
        // draw gridlines
        if (mYAxisSetup.mTickInfo.mTicksOn) {
            while (mYTickIterator->GetNextTick (theY, theIsMajorTick, theFormatString)) {

                if (theIsMajorTick && mGridInfo.mYGridOn) {
                    float theScreenY = mYTrafo->Transform(theY);
                    inPainter.DrawLine (inRect.mX, theScreenY, inRect.mX + inRect.mW, theScreenY);
                }
            }
        }

        inPainter.SetFillColor (0,0,0);
        inPainter.SetLineColor (0,0,0);
        return true;
    }